

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_header(opj_stream_private_t *p_stream,opj_j2k_t *p_j2k,opj_image_t **p_image,
                            opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_image_t *poVar2;
  opj_event_mgr_t *p_manager_local;
  opj_image_t **p_image_local;
  opj_j2k_t *p_j2k_local;
  opj_stream_private_t *p_stream_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1d4a,
                  "OPJ_BOOL opj_j2k_read_header(opj_stream_private_t *, opj_j2k_t *, opj_image_t **, opj_event_mgr_t *)"
                 );
  }
  if (p_stream != (opj_stream_private_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      poVar2 = opj_image_create0();
      p_j2k->m_private_image = poVar2;
      if (p_j2k->m_private_image == (opj_image_t *)0x0) {
        p_stream_local._4_4_ = 0;
      }
      else {
        OVar1 = opj_j2k_setup_decoding_validation(p_j2k,p_manager);
        if (OVar1 == 0) {
          opj_image_destroy(p_j2k->m_private_image);
          p_j2k->m_private_image = (opj_image_t *)0x0;
          p_stream_local._4_4_ = 0;
        }
        else {
          OVar1 = opj_j2k_exec(p_j2k,p_j2k->m_validation_list,p_stream,p_manager);
          if (OVar1 == 0) {
            opj_image_destroy(p_j2k->m_private_image);
            p_j2k->m_private_image = (opj_image_t *)0x0;
            p_stream_local._4_4_ = 0;
          }
          else {
            OVar1 = opj_j2k_setup_header_reading(p_j2k,p_manager);
            if (OVar1 == 0) {
              opj_image_destroy(p_j2k->m_private_image);
              p_j2k->m_private_image = (opj_image_t *)0x0;
              p_stream_local._4_4_ = 0;
            }
            else {
              OVar1 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
              if (OVar1 == 0) {
                opj_image_destroy(p_j2k->m_private_image);
                p_j2k->m_private_image = (opj_image_t *)0x0;
                p_stream_local._4_4_ = 0;
              }
              else {
                poVar2 = opj_image_create0();
                *p_image = poVar2;
                if (*p_image == (opj_image_t *)0x0) {
                  p_stream_local._4_4_ = 0;
                }
                else {
                  opj_copy_image_header(p_j2k->m_private_image,*p_image);
                  OVar1 = opj_j2k_allocate_tile_element_cstr_index(p_j2k);
                  if (OVar1 == 0) {
                    p_stream_local._4_4_ = 0;
                  }
                  else {
                    p_stream_local._4_4_ = 1;
                  }
                }
              }
            }
          }
        }
      }
      return p_stream_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1d4c,
                  "OPJ_BOOL opj_j2k_read_header(opj_stream_private_t *, opj_j2k_t *, opj_image_t **, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x1d4b,
                "OPJ_BOOL opj_j2k_read_header(opj_stream_private_t *, opj_j2k_t *, opj_image_t **, opj_event_mgr_t *)"
               );
}

Assistant:

OPJ_BOOL opj_j2k_read_header(opj_stream_private_t *p_stream,
                             opj_j2k_t* p_j2k,
                             opj_image_t** p_image,
                             opj_event_mgr_t* p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    /* create an empty image header */
    p_j2k->m_private_image = opj_image_create0();
    if (! p_j2k->m_private_image) {
        return OPJ_FALSE;
    }

    /* customization of the validation */
    if (! opj_j2k_setup_decoding_validation(p_j2k, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* validation of the parameters codec */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_validation_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* customization of the encoding */
    if (! opj_j2k_setup_header_reading(p_j2k, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* read header */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    *p_image = opj_image_create0();
    if (!(*p_image)) {
        return OPJ_FALSE;
    }

    /* Copy codestream image information to the output image */
    opj_copy_image_header(p_j2k->m_private_image, *p_image);

    /*Allocate and initialize some elements of codestrem index*/
    if (!opj_j2k_allocate_tile_element_cstr_index(p_j2k)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}